

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O2

int16_t OPL3_EnvelopeCalcSin7(uint16_t phase,uint16_t envelope)

{
  uint uVar1;
  undefined6 in_register_00000032;
  uint uVar2;
  bool bVar3;
  
  uVar2 = phase & 0x3ff;
  bVar3 = (ushort)uVar2 < 0x200;
  uVar1 = ~(uint)phase & 0x1ff;
  if (bVar3) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 * 8 + (int)CONCAT62(in_register_00000032,envelope) * 8;
  uVar1 = 0x1fff;
  if (uVar2 < 0x1fff) {
    uVar1 = uVar2;
  }
  return (ushort)((uint)exprom[uVar1 & 0xff] * 2 >> ((byte)(uVar1 >> 8) & 0x1f)) ^ bVar3 - 1;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin7(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    uint16_t neg = 0;
    phase &= 0x3ff;
    if (phase & 0x200)
    {
        neg = 0xffff;
        phase = (phase & 0x1ff) ^ 0x1ff;
    }
    out = phase << 3;
    return OPL3_EnvelopeCalcExp(out + (envelope << 3)) ^ neg;
}